

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

sexp sexp_quotient(sexp ctx,sexp a,sexp b)

{
  undefined1 auVar1 [16];
  int iVar2;
  int iVar3;
  sexp psVar4;
  ulong uVar5;
  double dVar6;
  sexp psStack_50;
  sexp tmp;
  double local_38;
  sexp_gc_var_t local_30;
  
  iVar2 = sexp_number_type(a);
  iVar3 = sexp_number_type(b);
  tmp = (sexp)&DAT_0000043e;
  if (b == (sexp)&DAT_00000003) {
    return a;
  }
  local_30.var = &tmp;
  local_30.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_30;
  psStack_50 = (sexp)&DAT_0000043e;
  switch(iVar2 * 6 + iVar3) {
  case 6:
  case 10:
  case 0xb:
  case 0xc:
  case 0x12:
  case 0x16:
  case 0x17:
    goto switchD_0011a75f_caseD_6;
  case 7:
    auVar1._8_8_ = (long)a >> 0x3f;
    auVar1._0_8_ = (long)a >> 1;
    uVar5 = SUB168(auVar1 / SEXT816((long)b >> 1),0);
    if ((long)((ulong)a & (ulong)b & uVar5) < 0) {
      tmp = sexp_fixnum_to_bignum(ctx,a);
      psStack_50 = sexp_quotient(ctx,tmp,b);
    }
    else {
      psStack_50 = (sexp)(uVar5 * 2 + 1);
    }
    break;
  case 8:
  case 0x14:
  case 0x1a:
    local_38 = (b->value).flonum;
    dVar6 = trunc(local_38);
    if ((local_38 == dVar6) && (!NAN(local_38) && !NAN(dVar6))) {
      psVar4 = sexp_double_to_bignum(ctx,local_38);
      b = sexp_bignum_normalize(psVar4);
      tmp = b;
LAB_0011a81f:
      tmp = sexp_quotient(ctx,a,b);
      psStack_50 = sexp_to_inexact(ctx,tmp);
      break;
    }
    goto switchD_0011a75f_caseD_6;
  case 9:
    psStack_50 = (sexp)&DAT_00000001;
    break;
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
    local_38 = (a->value).flonum;
    dVar6 = trunc(local_38);
    if ((local_38 == dVar6) && (!NAN(local_38) && !NAN(dVar6))) {
      psVar4 = sexp_double_to_bignum(ctx,local_38);
      a = sexp_bignum_normalize(psVar4);
      tmp = a;
      goto LAB_0011a81f;
    }
  case 0:
  case 1:
  case 2:
  case 3:
  case 0x11:
  case 0x19:
  case 0x1b:
  case 0x1c:
  case 0x1f:
  case 0x20:
  case 0x21:
  case 0x22:
  case 0x23:
LAB_0011a7db:
    psStack_50 = sexp_type_exception(ctx,(sexp)0x0,2,a);
    break;
  case 0x13:
    b = sexp_fixnum_to_bignum(ctx,b);
    tmp = b;
  case 0x15:
    psVar4 = sexp_bignum_quotient(ctx,a,b);
    psStack_50 = sexp_bignum_normalize(psVar4);
  }
  (ctx->value).context.saves = local_30.next;
  return psStack_50;
switchD_0011a75f_caseD_6:
  a = b;
  goto LAB_0011a7db;
}

Assistant:

sexp sexp_quotient (sexp ctx, sexp a, sexp b) {
  int at=sexp_number_type(a), bt=sexp_number_type(b);
  sexp r=SEXP_VOID;
  sexp_gc_var1(tmp);
  if (b == SEXP_ONE) return a;
  sexp_gc_preserve1(ctx, tmp);
  switch ((at * SEXP_NUM_NUMBER_TYPES) + bt) {
  case SEXP_NUM_NOT_NOT: case SEXP_NUM_NOT_FIX:
  case SEXP_NUM_NOT_FLO: case SEXP_NUM_NOT_BIG:
    r = sexp_type_exception(ctx, NULL, SEXP_FIXNUM, a);
    break;
  case SEXP_NUM_FIX_NOT: case SEXP_NUM_FLO_NOT: case SEXP_NUM_BIG_NOT:
    r = sexp_type_exception(ctx, NULL, SEXP_FIXNUM, b);
    break;
  case SEXP_NUM_FLO_FIX: case SEXP_NUM_FLO_FLO: case SEXP_NUM_FLO_BIG:
#if SEXP_USE_RATIOS
  case SEXP_NUM_FLO_RAT:
#endif
    if (sexp_flonum_value(a) != trunc(sexp_flonum_value(a))) {
      r = sexp_type_exception(ctx, NULL, SEXP_FIXNUM, a);
    } else {
      tmp = sexp_bignum_normalize(sexp_double_to_bignum(ctx, sexp_flonum_value(a)));
      tmp = sexp_quotient(ctx, tmp, b);
      r = sexp_to_inexact(ctx, tmp);
    }
    break;
#if SEXP_USE_RATIOS
  case SEXP_NUM_RAT_FIX: case SEXP_NUM_RAT_BIG: case SEXP_NUM_RAT_RAT:
#endif
#if SEXP_USE_COMPLEX
  case SEXP_NUM_FLO_CPX: case SEXP_NUM_CPX_FIX: case SEXP_NUM_CPX_FLO:
  case SEXP_NUM_CPX_BIG: case SEXP_NUM_CPX_CPX:
#if SEXP_USE_RATIOS
  case SEXP_NUM_CPX_RAT:
#endif
#endif
    r = sexp_type_exception(ctx, NULL, SEXP_FIXNUM, a);
    break;
  case SEXP_NUM_FIX_FLO: case SEXP_NUM_BIG_FLO:
#if SEXP_USE_RATIOS
  case SEXP_NUM_RAT_FLO:
#endif
    if (sexp_flonum_value(b) != trunc(sexp_flonum_value(b))) {
      r = sexp_type_exception(ctx, NULL, SEXP_FIXNUM, b);
    } else {
      tmp = sexp_bignum_normalize(sexp_double_to_bignum(ctx, sexp_flonum_value(b)));
      tmp = sexp_quotient(ctx, a, tmp);
      r = sexp_to_inexact(ctx, tmp);
    }
    break;
#if SEXP_USE_RATIOS
  case SEXP_NUM_FIX_RAT: case SEXP_NUM_BIG_RAT:
#endif
#if SEXP_USE_COMPLEX
  case SEXP_NUM_FIX_CPX: case SEXP_NUM_BIG_CPX:
#endif
    r = sexp_type_exception(ctx, NULL, SEXP_FIXNUM, b);
    break;
  case SEXP_NUM_FIX_FIX:
    r = sexp_fx_div(a, b);
    if ((sexp_sint_t)a < 0 && (sexp_sint_t)b < 0 && (sexp_sint_t)r < 0) {
      r = sexp_quotient(ctx, tmp=sexp_fixnum_to_bignum(ctx, a), b);
    }
    break;
  case SEXP_NUM_FIX_BIG:
    r = SEXP_ZERO;
    break;
  case SEXP_NUM_BIG_FIX:
    b = tmp = sexp_fixnum_to_bignum(ctx, b);
    /* ... FALLTHROUGH ... */
  case SEXP_NUM_BIG_BIG:
    r = sexp_bignum_normalize(sexp_bignum_quotient(ctx, a, b));
    break;
  }
  sexp_gc_release1(ctx);
  return r;
}